

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>::~Stack
          (Stack<std::pair<Kernel::SymbolType,_unsigned_int>_> *this)

{
  pair<Kernel::SymbolType,_unsigned_int> *ppVar1;
  ulong uVar2;
  
  ppVar1 = this->_stack;
  if (ppVar1 != (pair<Kernel::SymbolType,_unsigned_int> *)0x0) {
    uVar2 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppVar1;
      return;
    }
    if (uVar2 < 0x11) {
      ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
      ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppVar1;
      return;
    }
    if (uVar2 < 0x19) {
      ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
      ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppVar1;
      return;
    }
    if (uVar2 < 0x21) {
      ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppVar1;
      return;
    }
    if (uVar2 < 0x31) {
      ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppVar1;
      return;
    }
    if (0x40 < uVar2) {
      operator_delete(ppVar1,0x10);
      return;
    }
    ppVar1->first = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
    ppVar1->second = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppVar1;
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }